

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O1

shared_ptr<QPDFObject> __thiscall
QPDFObject::create<QPDF_InlineImage,std::__cxx11::string_const&>
          (QPDFObject *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<QPDFObject> sVar4;
  undefined1 local_61;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  QPDF_InlineImage local_40;
  
  pcVar2 = (args->_M_dataplus)._M_p;
  local_60 = &local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + args->_M_string_length);
  paVar1 = &local_40.val.field_2;
  if (local_60 == &local_50) {
    local_40.val.field_2._8_8_ = local_50._8_8_;
    local_40.val._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_40.val._M_dataplus._M_p = (pointer)local_60;
  }
  local_40.val.field_2._M_allocated_capacity._1_7_ = local_50._M_allocated_capacity._1_7_;
  local_40.val.field_2._M_local_buf[0] = local_50._M_local_buf[0];
  local_40.val._M_string_length = local_58;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  *(undefined8 *)
   &(this->value).
    super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
    .
    super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
    .
    super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
    .
    super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
    .
    super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
    .
    super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
       = 0;
  local_60 = &local_50;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<QPDFObject,std::allocator<QPDFObject>,QPDF_InlineImage>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(this->value).
                     super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             + 8),(QPDFObject **)this,(allocator<QPDFObject> *)&local_61,&local_40);
  _Var3._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.val._M_dataplus._M_p,local_40.val.field_2._M_allocated_capacity + 1);
    _Var3._M_pi = extraout_RDX_00;
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0])
                             + 1);
    _Var3._M_pi = extraout_RDX_01;
  }
  sVar4.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<QPDFObject>)sVar4.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<QPDFObject>
QPDFObject::create(Args&&... args)
{
    return std::make_shared<QPDFObject>(std::forward<T>(T(std::forward<Args>(args)...)));
}